

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Instruction::UpdateDebugInlinedAt(Instruction *this,uint32_t new_inlined_at)

{
  bool bVar1;
  reference pIVar2;
  IRContext *pIVar3;
  DebugInfoManager *this_00;
  Instruction *i;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *__range2;
  uint32_t new_inlined_at_local;
  Instruction *this_local;
  
  DebugScope::SetInlinedAt(&this->dbg_scope_,new_inlined_at);
  __end2 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
           begin(&this->dbg_line_insts_);
  i = (Instruction *)
      std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::end
                (&this->dbg_line_insts_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
                                     *)&i), bVar1) {
    pIVar2 = __gnu_cxx::
             __normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
             ::operator*(&__end2);
    DebugScope::SetInlinedAt(&pIVar2->dbg_scope_,new_inlined_at);
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
    ::operator++(&__end2);
  }
  bVar1 = IsLineInst(this);
  if (!bVar1) {
    pIVar3 = context(this);
    bVar1 = IRContext::AreAnalysesValid(pIVar3,kAnalysisDebugInfo);
    if (bVar1) {
      pIVar3 = context(this);
      this_00 = IRContext::get_debug_info_mgr(pIVar3);
      analysis::DebugInfoManager::AnalyzeDebugInst(this_00,this);
    }
  }
  return;
}

Assistant:

void Instruction::UpdateDebugInlinedAt(uint32_t new_inlined_at) {
  dbg_scope_.SetInlinedAt(new_inlined_at);
  for (auto& i : dbg_line_insts_) {
    i.dbg_scope_.SetInlinedAt(new_inlined_at);
  }
  if (!IsLineInst() &&
      context()->AreAnalysesValid(IRContext::kAnalysisDebugInfo)) {
    context()->get_debug_info_mgr()->AnalyzeDebugInst(this);
  }
}